

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalRightDelimJoin,duckdb::PhysicalPlanGenerator&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,true>&,unsigned_long&,duckdb::optional_idx>
          (PhysicalPlan *this,PhysicalPlanGenerator *args,vector<duckdb::LogicalType,_true> *args_1,
          PhysicalOperator *args_2,PhysicalOperator *args_3,
          vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *args_4,
          unsigned_long *args_5,optional_idx *args_6)

{
  PhysicalOperator *this_00;
  reference_wrapper<duckdb::PhysicalOperator> local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  this_00 = (PhysicalOperator *)ArenaAllocator::AllocateAligned(&this->arena,0xb0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             &args_1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  PhysicalRightDelimJoin::PhysicalRightDelimJoin
            ((PhysicalRightDelimJoin *)this_00,args,(vector<duckdb::LogicalType,_true> *)&local_48,
             args_2,args_3,args_4,*args_5,(optional_idx)args_6->index);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  local_50._M_data = this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_50);
  return this_00;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}